

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O3

void set_mi_row_col(MACROBLOCKD *xd,TileInfo *tile,int mi_row,int bh,int mi_col,int bw,int mi_rows,
                   int mi_cols)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  MB_MODE_INFO *pMVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  int in_stack_00000018;
  
  xd->mb_to_top_edge = bh * -0x20;
  xd->mb_to_bottom_edge = ((mi_cols - mi_col) - bh) * 0x20;
  xd->mb_to_left_edge = bw * -0x20;
  xd->mb_to_right_edge = ((in_stack_00000018 - mi_rows) - bw) * 0x20;
  xd->mi_row = bh;
  xd->mi_col = bw;
  xd->left_available = mi_row < bw;
  iVar5 = (int)tile;
  bVar2 = iVar5 < bh;
  xd->up_available = iVar5 < bh;
  uVar3 = xd->plane[1].subsampling_x;
  uVar1 = xd->plane[1].subsampling_y;
  xd->chroma_up_available = iVar5 < bh;
  bVar6 = mi_row < bw + -1;
  if (uVar3 == 0) {
    bVar6 = mi_row < bw;
  }
  if (1 < mi_rows) {
    bVar6 = mi_row < bw;
  }
  xd->chroma_left_available = bVar6;
  if (mi_col < 2 && uVar1 != 0) {
    bVar2 = iVar5 < bh + -1;
    xd->chroma_up_available = iVar5 < bh + -1;
  }
  if (iVar5 < bh) {
    pMVar4 = xd->mi[-(long)xd->mi_stride];
  }
  else {
    pMVar4 = (MB_MODE_INFO *)0x0;
  }
  xd->above_mbmi = pMVar4;
  if (mi_row < bw) {
    pMVar4 = xd->mi[-1];
  }
  else {
    pMVar4 = (MB_MODE_INFO *)0x0;
  }
  xd->left_mbmi = pMVar4;
  if (((bh & 1U) == 0) && (((byte)mi_col & uVar1 != 0) != 0)) {
    xd->is_chroma_ref = false;
  }
  else {
    if ((mi_rows & 1U) == 0 || (bw & 1U) != 0) {
      xd->is_chroma_ref = true;
    }
    else {
      xd->is_chroma_ref = uVar3 == 0;
      if (uVar3 != 0) goto LAB_0018017e;
    }
    iVar5 = xd->mi_stride;
    iVar7 = (uVar3 & bw) + (uVar1 & bh) * iVar5;
    if (bVar2) {
      pMVar4 = xd->mi[(long)-iVar7 + (long)(int)(uVar3 - iVar5)];
    }
    else {
      pMVar4 = (MB_MODE_INFO *)0x0;
    }
    xd->chroma_above_mbmi = pMVar4;
    if (bVar6 == false) {
      pMVar4 = (MB_MODE_INFO *)0x0;
    }
    else {
      pMVar4 = xd->mi[(long)-iVar7 + (long)(int)(iVar5 * uVar1) + -1];
    }
    xd->chroma_left_mbmi = pMVar4;
  }
LAB_0018017e:
  xd->height = (byte)mi_col;
  xd->width = (uint8_t)mi_rows;
  xd->is_last_vertical_rect = false;
  uVar3 = mi_rows & 0xff;
  if ((uVar3 < (mi_col & 0xffU)) && ((bw + uVar3 & (mi_col & 0xffU) - 1) == 0)) {
    xd->is_last_vertical_rect = true;
  }
  xd->is_first_horizontal_rect = false;
  if (((uint)mi_col < (uint)mi_rows) && ((uVar3 - 1 & bh) == 0)) {
    xd->is_first_horizontal_rect = true;
  }
  return;
}

Assistant:

static inline void set_mi_row_col(MACROBLOCKD *xd, const TileInfo *const tile,
                                  int mi_row, int bh, int mi_col, int bw,
                                  int mi_rows, int mi_cols) {
  xd->mb_to_top_edge = -GET_MV_SUBPEL(mi_row * MI_SIZE);
  xd->mb_to_bottom_edge = GET_MV_SUBPEL((mi_rows - bh - mi_row) * MI_SIZE);
  xd->mb_to_left_edge = -GET_MV_SUBPEL((mi_col * MI_SIZE));
  xd->mb_to_right_edge = GET_MV_SUBPEL((mi_cols - bw - mi_col) * MI_SIZE);

  xd->mi_row = mi_row;
  xd->mi_col = mi_col;

  // Are edges available for intra prediction?
  xd->up_available = (mi_row > tile->mi_row_start);

  const int ss_x = xd->plane[1].subsampling_x;
  const int ss_y = xd->plane[1].subsampling_y;

  xd->left_available = (mi_col > tile->mi_col_start);
  xd->chroma_up_available = xd->up_available;
  xd->chroma_left_available = xd->left_available;
  if (ss_x && bw < mi_size_wide[BLOCK_8X8])
    xd->chroma_left_available = (mi_col - 1) > tile->mi_col_start;
  if (ss_y && bh < mi_size_high[BLOCK_8X8])
    xd->chroma_up_available = (mi_row - 1) > tile->mi_row_start;
  if (xd->up_available) {
    xd->above_mbmi = xd->mi[-xd->mi_stride];
  } else {
    xd->above_mbmi = NULL;
  }

  if (xd->left_available) {
    xd->left_mbmi = xd->mi[-1];
  } else {
    xd->left_mbmi = NULL;
  }

  const int chroma_ref = ((mi_row & 0x01) || !(bh & 0x01) || !ss_y) &&
                         ((mi_col & 0x01) || !(bw & 0x01) || !ss_x);
  xd->is_chroma_ref = chroma_ref;
  if (chroma_ref) {
    // To help calculate the "above" and "left" chroma blocks, note that the
    // current block may cover multiple luma blocks (e.g., if partitioned into
    // 4x4 luma blocks).
    // First, find the top-left-most luma block covered by this chroma block
    MB_MODE_INFO **base_mi =
        &xd->mi[-(mi_row & ss_y) * xd->mi_stride - (mi_col & ss_x)];

    // Then, we consider the luma region covered by the left or above 4x4 chroma
    // prediction. We want to point to the chroma reference block in that
    // region, which is the bottom-right-most mi unit.
    // This leads to the following offsets:
    MB_MODE_INFO *chroma_above_mi =
        xd->chroma_up_available ? base_mi[-xd->mi_stride + ss_x] : NULL;
    xd->chroma_above_mbmi = chroma_above_mi;

    MB_MODE_INFO *chroma_left_mi =
        xd->chroma_left_available ? base_mi[ss_y * xd->mi_stride - 1] : NULL;
    xd->chroma_left_mbmi = chroma_left_mi;
  }

  xd->height = bh;
  xd->width = bw;

  xd->is_last_vertical_rect = 0;
  if (xd->width < xd->height) {
    if (!((mi_col + xd->width) & (xd->height - 1))) {
      xd->is_last_vertical_rect = 1;
    }
  }

  xd->is_first_horizontal_rect = 0;
  if (xd->width > xd->height)
    if (!(mi_row & (xd->width - 1))) xd->is_first_horizontal_rect = 1;
}